

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

Result<wasm::Type> *
wasm::WATParser::anon_unknown_11::
valtype<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  ParseInput *this;
  undefined8 *puVar1;
  undefined1 *puVar2;
  _Uninitialized<wasm::Type,_true> _Var3;
  bool bVar4;
  bool bVar5;
  HeapType heapType;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  Result<wasm::HeapType> type_1;
  MaybeResult<wasm::Type> type;
  Result<wasm::HeapType> _val;
  
  this = &ctx->in;
  expected._M_str = "i32";
  expected._M_len = 3;
  bVar4 = ParseInput::takeKeyword(this,expected);
  if (bVar4) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 2;
LAB_00a23208:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x20) = '\0';
    return __return_storage_ptr__;
  }
  expected_00._M_str = "i64";
  expected_00._M_len = 3;
  bVar4 = ParseInput::takeKeyword(this,expected_00);
  if (bVar4) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 3;
    goto LAB_00a23208;
  }
  expected_01._M_str = "f32";
  expected_01._M_len = 3;
  bVar4 = ParseInput::takeKeyword(this,expected_01);
  if (bVar4) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 4;
    goto LAB_00a23208;
  }
  expected_02._M_str = "f64";
  expected_02._M_len = 3;
  bVar4 = ParseInput::takeKeyword(this,expected_02);
  if (bVar4) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 5;
    goto LAB_00a23208;
  }
  expected_03._M_str = "v128";
  expected_03._M_len = 4;
  bVar4 = ParseInput::takeKeyword(this,expected_03);
  if (bVar4) {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = 6;
    goto LAB_00a23208;
  }
  expected_04._M_str = "funcref";
  expected_04._M_len = 7;
  bVar4 = ParseInput::takeKeyword(this,expected_04);
  if (bVar4) {
    heapType.id = 1;
  }
  else {
    expected_05._M_str = "externref";
    expected_05._M_len = 9;
    bVar4 = ParseInput::takeKeyword(this,expected_05);
    if (bVar4) {
      heapType.id = 0;
    }
    else {
      expected_06._M_str = "anyref";
      expected_06._M_len = 6;
      bVar4 = ParseInput::takeKeyword(this,expected_06);
      if (bVar4) {
        heapType.id = 2;
      }
      else {
        expected_07._M_str = "eqref";
        expected_07._M_len = 5;
        bVar4 = ParseInput::takeKeyword(this,expected_07);
        if (bVar4) {
          heapType.id = 3;
        }
        else {
          expected_08._M_str = "i31ref";
          expected_08._M_len = 6;
          bVar4 = ParseInput::takeKeyword(this,expected_08);
          if (bVar4) {
            heapType.id = 4;
          }
          else {
            expected_09._M_str = "structref";
            expected_09._M_len = 9;
            bVar4 = ParseInput::takeKeyword(this,expected_09);
            if (!bVar4) {
              expected_10._M_str = "arrayref";
              expected_10._M_len = 8;
              bVar4 = ParseInput::takeKeyword(this,expected_10);
              if (bVar4) {
                puVar2 = (undefined1 *)
                         ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
                type.val.
                super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                ._32_8_ = puVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)
                           ((long)&type.val.
                                   super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                   .
                                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 0x20),"arrayref not yet supported","");
                ParseInput::err((Err *)local_a8,this,
                                (string *)
                                ((long)&type.val.
                                        super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                        .
                                        super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                        .
                                        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                        .
                                        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                        .
                                        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                + 0x20));
                type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ =
                     (long)&type.val.
                            super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                            .
                            super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                     + 8;
                _Var3._M_storage.id =
                     (Type)((long)&type_1.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8)
                ;
                if ((Type)local_a8 == _Var3._M_storage.id) {
                  type.val.
                  super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                  ._M_u._16_8_ = type_1.val.
                                 super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 _M_u._16_8_;
                }
                else {
                  type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ =
                       local_a8;
                }
                type.val.
                super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                ._M_u._M_first._M_storage.id =
                     (_Uninitialized<wasm::Type,_true>)
                     type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u.
                     _M_first._M_storage.id;
                type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
                _M_storage.id = (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
                type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_ = 0;
                type.val.
                super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                ._M_u._24_1_ = 2;
                local_a8 = (undefined1  [8])_Var3;
                if ((undefined1 *)
                    type.val.
                    super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    ._32_8_ != puVar2) {
                  operator_delete((void *)type.val.
                                          super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          .
                                          super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          .
                                          super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          .
                                          super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          .
                                          super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                          ._32_8_,
                                  CONCAT71(_val.val.
                                           super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                           .
                                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                           .
                                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                           .
                                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                           .
                                           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>
                                           ._M_u._9_7_,
                                           _val.val.
                                           super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                           .
                                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                           .
                                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                           .
                                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                           .
                                           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>
                                           ._M_u._8_1_) + 1);
                }
              }
              else {
                expected_11._M_str = "ref";
                expected_11._M_len = 3;
                bVar4 = ParseInput::takeSExprStart(this,expected_11);
                if (bVar4) {
                  expected_12._M_str = "null";
                  expected_12._M_len = 4;
                  bVar4 = ParseInput::takeKeyword(this,expected_12);
                  heaptype<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                            ((Result<wasm::HeapType> *)local_a8,ctx);
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>::_Copy_ctor_base
                            ((_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                             ((long)&type.val.
                                     super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                     .
                                     super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             + 0x20),(_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *
                                     )local_a8);
                  if (_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_
                      == '\x01') {
                    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_c8,
                               type.val.
                               super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               ._32_8_,(long)_val.val.
                                             super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>
                                             .
                                             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                             .
                                             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                             .
                                             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                             .
                                             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                             .
                                             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>
                                             ._M_u._M_first._M_storage.id +
                                       type.val.
                                       super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       ._32_8_);
                    type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ =
                         (long)&type.val.
                                super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                .
                                super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         + 8;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
                      type.val.
                      super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._M_u._16_8_ = local_c8.field_2._8_8_;
                    }
                    else {
                      type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ =
                           local_c8._M_dataplus._M_p;
                    }
                    type.val.
                    super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    ._M_u._M_first._M_storage.id =
                         (_Uninitialized<wasm::Type,_true>)
                         (_Uninitialized<wasm::Type,_true>)local_c8._M_string_length;
                    type.val.
                    super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    .
                    super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                    ._M_u._24_1_ = 2;
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                               ((long)&type.val.
                                       super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               + 0x20));
                  }
                  else {
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                               ((long)&type.val.
                                       super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                       .
                                       super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               + 0x20));
                    bVar5 = ParseInput::takeRParen(this);
                    if (bVar5) {
                      wasm::Type::Type((Type *)((long)&type.val.
                                                  super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                               + 0x20),(HeapType)local_a8,(uint)bVar4);
                      type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_index =
                           type.val.
                           super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           ._M_index;
                      type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._33_7_ =
                           type.val.
                           super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           .
                           super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           ._33_7_;
                      type.val.
                      super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._M_u._24_1_ = 0;
                    }
                    else {
                      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_c8,"expected end of reftype","");
                      ParseInput::err((Err *)((long)&type.val.
                                                  super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                             + 0x20),this,&local_c8);
                      type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ =
                           (long)&type.val.
                                  super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                                  .
                                  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                           + 8;
                      puVar2 = (undefined1 *)
                               ((long)&_val.val.
                                       super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                               + 8);
                      if ((undefined1 *)
                          type.val.
                          super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                          .
                          super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                          ._32_8_ == puVar2) {
                        type.val.
                        super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                        .
                        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                        ._M_u._16_8_ = _val.val.
                                       super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .
                                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       .
                                       super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>
                                       ._M_u._16_8_;
                      }
                      else {
                        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_index
                             = type.val.
                               super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               .
                               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                               ._M_index;
                        type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._33_7_ =
                             type.val.
                             super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             .
                             super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                             ._33_7_;
                      }
                      type.val.
                      super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._M_u._M_first._M_storage.id =
                           (_Uninitialized<wasm::Type,_true>)
                           (_Uninitialized<wasm::Type,_true>)
                           _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u.
                           _M_first._M_storage.id;
                      _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u.
                      _M_first._M_storage.id = (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
                      _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_
                           = 0;
                      type.val.
                      super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._M_u._24_1_ = 2;
                      type.val.
                      super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      .
                      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                      ._32_8_ = puVar2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                        operator_delete(local_c8._M_dataplus._M_p,
                                        local_c8.field_2._M_allocated_capacity + 1);
                      }
                    }
                  }
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::~_Variant_storage
                            ((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                             local_a8);
                }
                else {
                  type.val.
                  super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
                  super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                  ._M_u._24_1_ = 1;
                }
              }
              goto LAB_00a2327b;
            }
            heapType.id = 5;
          }
        }
      }
    }
  }
  wasm::Type::Type((Type *)((long)&type_1.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20),heapType,Nullable);
  type.val.super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u._24_1_
       = 0;
LAB_00a2327b:
  if (type.val.super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>._M_u.
      _24_1_ == '\x01') {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"expected valtype","");
    ParseInput::err((Err *)local_a8,this,&local_e8);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = puVar1;
    _Var3._M_storage.id =
         (Type)((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
    if ((Type)local_a8 == _Var3._M_storage.id) {
      *puVar1 = CONCAT71(type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                         super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u.
                         _9_7_,type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               _M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x18) =
           type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = local_a8;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x10) =
           CONCAT71(type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._9_7_,
                    type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_);
    }
    ((_Uninitialized<wasm::HeapType,_true> *)
    ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 8))->_M_storage =
         (HeapType)
         type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
         super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
         super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage
         .id;
    type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.id =
         (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
    type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x20) = '\x01';
    local_a8 = (undefined1  [8])_Var3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err> *)
               local_a8,(_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)((long)&type_1.val.
                                   super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> +
                           0x20));
    if (type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x02') {
      puVar2 = (undefined1 *)
               ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 8);
      type.val.super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>._32_8_ =
           puVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&type.val.
                         super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         .
                         super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                 + 0x20),local_a8,
                 (pointer)((long)type_1.val.
                                 super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 _M_u._M_first._M_storage.id + (long)local_a8));
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                       super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> = puVar1;
      if ((undefined1 *)
          type.val.super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
          _32_8_ == puVar2) {
        *puVar1 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u.
                           _9_7_,_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                 _M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>
                 .super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x18) =
             _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> =
             type.val.super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
             _32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x10) =
             CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._9_7_,
                      _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_)
        ;
      }
      ((_Uninitialized<wasm::HeapType,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 8))->_M_storage =
           (HeapType)
           _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first.
           _M_storage.id;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._M_first._M_storage.id
           = (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x20) = '\x01';
      type.val.super__Variant_base<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>._32_8_ =
           puVar2;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_a8);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                         *)local_a8);
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> =
           type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err> + 0x20) = '\0';
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::None,_wasm::WATParser::Err>
                     *)((long)&type_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20))
  ;
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> valtype(Ctx& ctx) {
  if (ctx.in.takeKeyword("i32"sv)) {
    return ctx.makeI32();
  } else if (ctx.in.takeKeyword("i64"sv)) {
    return ctx.makeI64();
  } else if (ctx.in.takeKeyword("f32"sv)) {
    return ctx.makeF32();
  } else if (ctx.in.takeKeyword("f64"sv)) {
    return ctx.makeF64();
  } else if (ctx.in.takeKeyword("v128"sv)) {
    return ctx.makeV128();
  } else if (auto type = reftype(ctx)) {
    CHECK_ERR(type);
    return *type;
  } else {
    return ctx.in.err("expected valtype");
  }
}